

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O2

BrandTypeIterator * __thiscall
wasm::anon_unknown_0::BrandTypeIterator::operator++(BrandTypeIterator *this)

{
  pointer this_00;
  pointer pFVar1;
  ushort uVar2;
  FieldInfo *pFVar3;
  FieldInfo *pFVar4;
  pointer pFVar5;
  ulong uVar6;
  size_t extraout_RDX;
  size_t __n;
  ulong uVar7;
  ulong uVar8;
  FieldInfo *pFVar9;
  bool bVar10;
  
  this_00 = (this->fields).
            super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (this->fields).
           super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = (long)pFVar1 - (long)this_00 >> 1;
  uVar7 = uVar8 & 0xffffffff;
  while( true ) {
    bVar10 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar10) {
      if (this->useArray == true) {
        this->useArray = false;
        return this;
      }
      if (pFVar1 == (this->fields).
                    super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        if ((long)pFVar1 - (long)this_00 == 0x7ffffffffffffffe) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar7 = 1;
        if (pFVar1 != this_00) {
          uVar7 = uVar8;
        }
        uVar6 = uVar7 + uVar8;
        if (0x3ffffffffffffffe < uVar6) {
          uVar6 = 0x3fffffffffffffff;
        }
        if (CARRY8(uVar7,uVar8)) {
          uVar6 = 0x3fffffffffffffff;
        }
        if (uVar6 == 0) {
          pFVar4 = (FieldInfo *)0x0;
          __n = 0;
        }
        else {
          pFVar4 = (FieldInfo *)operator_new(uVar6 * 2);
          __n = extraout_RDX;
        }
        pFVar4[uVar8].index = '\0';
        pFVar4[uVar8].immutable = false;
        pFVar3 = pFVar4;
        for (pFVar5 = this_00; pFVar9 = pFVar3 + 1, pFVar5 != pFVar1; pFVar5 = pFVar5 + 1) {
          *pFVar3 = *pFVar5;
          pFVar3 = pFVar9;
        }
        std::
        _Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
        ::_M_deallocate((_Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                         *)this_00,
                        (pointer)((long)(this->fields).
                                        super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)this_00 >> 1),__n);
        (this->fields).
        super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pFVar4;
        (this->fields).
        super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pFVar9;
        (this->fields).
        super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar4 + uVar6;
      }
      else {
        pFVar1->index = '\0';
        pFVar1->immutable = false;
        pFVar4 = (this->fields).
                 super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pFVar9 = (this->fields).
                 super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
        (this->fields).
        super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pFVar9;
      }
      this->useArray = (long)pFVar9 - (long)pFVar4 == 2;
      return this;
    }
    if (this_00[uVar7].immutable == false) break;
    uVar2 = (ushort)(this_00[uVar7].index + 1) % 0x12;
    this_00[uVar7].index = (uint8_t)uVar2;
    this_00[uVar7].immutable = false;
    if (uVar2 != 0) {
      return this;
    }
  }
  this_00[uVar7].immutable = true;
  return this;
}

Assistant:

BrandTypeIterator& operator++() {
    for (Index i = fields.size(); i > 0; --i) {
      if (fields[i - 1].advance()) {
        return *this;
      }
    }
    if (useArray) {
      useArray = false;
      return *this;
    }
    fields.emplace_back();
    useArray = fields.size() == 1;
    return *this;
  }